

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
          (DictionaryTypeHandlerBase<int> *this,DictionaryTypeHandlerBase<int> *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  PropertyTypes values;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  int slotCapacity;
  undefined4 *puVar3;
  DictionaryTypeHandlerBase<int> *typeHandler_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  slotCapacity = DynamicTypeHandler::GetSlotCapacity(&typeHandler->super_DynamicTypeHandler);
  inlineSlotCapacity =
       DynamicTypeHandler::GetInlineSlotCapacity(&typeHandler->super_DynamicTypeHandler);
  offsetOfInlineSlots =
       DynamicTypeHandler::GetOffsetOfInlineSlots(&typeHandler->super_DynamicTypeHandler);
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,slotCapacity,inlineSlotCapacity,offsetOfInlineSlots,
             '\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e46568
  ;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->propertyMap,&typeHandler->propertyMap);
  this->nextPropertyIndex = typeHandler->nextPropertyIndex;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::WriteBarrierPtr
            (&this->singletonInstance,&typeHandler->singletonInstance);
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&typeHandler->super_DynamicTypeHandler);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x34,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&typeHandler->super_DynamicTypeHandler);
  DynamicTypeHandler::CopyPropertyTypes(&this->super_DynamicTypeHandler,0xf0,values);
  return;
}

Assistant:

DictionaryTypeHandlerBase<T>::DictionaryTypeHandlerBase(DictionaryTypeHandlerBase* typeHandler) :
        DynamicTypeHandler(typeHandler->GetSlotCapacity(), typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots()),
        propertyMap(typeHandler->propertyMap), nextPropertyIndex(typeHandler->nextPropertyIndex)
#if ENABLE_FIXED_FIELDS
        , singletonInstance(typeHandler->singletonInstance)
#endif
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked | PropertyTypesHasSpecialProperties, typeHandler->GetPropertyTypes());
    }